

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O1

int green_future_done(green_future_t future)

{
  int extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  int iVar1;
  undefined8 *in_RSI;
  
  if (future == (green_future_t)0x0) {
    return 1;
  }
  if (0 < future->refs) {
    return (int)(future->state - green_future_aborted < 2);
  }
  green_future_done_cold_1();
  if (future == (green_future_t)0x0) {
    iVar1 = 1;
  }
  else {
    if (future->refs < 1) {
      green_future_set_result_cold_1();
      if (future == (green_future_t)0x0) {
        return 1;
      }
      if (future->refs < 1) {
        green_future_result_cold_1();
        if (future == (green_future_t)0x0) {
          return 1;
        }
        if (0 < future->refs) {
          if (future->state != green_future_pending) {
            return 8;
          }
          future->state = green_future_aborted;
          return 0;
        }
        green_future_cancel_cold_1();
        halt_baddata();
      }
      if (future->state == green_future_pending) {
        return 3;
      }
      if (future->state == green_future_aborted) {
        return 8;
      }
      if (in_RSI != (undefined8 *)0x0) {
        *in_RSI = (future->result).p;
      }
      if (CONCAT44(extraout_var,extraout_EDX_00) != 0) {
        *(int *)CONCAT44(extraout_var,extraout_EDX_00) = (future->result).i;
      }
      return 0;
    }
    if (future->state == green_future_aborted) {
      iVar1 = 4;
    }
    else if (future->state == green_future_complete) {
      iVar1 = 8;
    }
    else {
      (future->result).i = extraout_EDX;
      (future->result).p = in_RSI;
      future->state = green_future_complete;
      iVar1 = 0;
      if (future->poller != (green_poller_t)0x0) {
        green_future_set_result_cold_2();
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int green_future_done(green_future_t future)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future->refs > 0);
    return (future->state == green_future_complete) ||
           (future->state == green_future_aborted);
}